

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parserInternals.c
# Opt level: O2

xmlError * xmlCtxtGetLastError(void *ctx)

{
  xmlError *pxVar1;
  
  if (ctx != (void *)0x0) {
    pxVar1 = (xmlError *)0x0;
    if (*(int *)((long)ctx + 0x25c) != 0) {
      pxVar1 = (xmlError *)((long)ctx + 600);
    }
    return pxVar1;
  }
  return (xmlError *)0x0;
}

Assistant:

const xmlError *
xmlCtxtGetLastError(void *ctx)
{
    xmlParserCtxtPtr ctxt = (xmlParserCtxtPtr) ctx;

    if (ctxt == NULL)
        return (NULL);
    if (ctxt->lastError.code == XML_ERR_OK)
        return (NULL);
    return (&ctxt->lastError);
}